

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_minmax(lysp_yin_ctx *ctx,ly_stmt parent_stmt,ly_stmt cur_stmt,void *dest)

{
  char cVar1;
  LY_ERR LVar2;
  int iVar3;
  long lVar4;
  ushort **ppuVar5;
  int *piVar6;
  ulonglong uVar7;
  char *format;
  char *pcVar8;
  ly_ctx *plVar9;
  lysp_ext_instance **exts;
  undefined4 *parent;
  char *temp_val;
  char *ptr;
  char *local_60;
  yin_subelement local_58;
  char *local_38;
  
  if ((cur_stmt != LY_STMT_MAX_ELEMENTS) && (cur_stmt != LY_STMT_MIN_ELEMENTS)) {
    __assert_fail("cur_stmt == LY_STMT_MAX_ELEMENTS || cur_stmt == LY_STMT_MIN_ELEMENTS",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0x5bc,
                  "LY_ERR yin_parse_minmax(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, void *)"
                 );
  }
  if ((int)parent_stmt < 0x90000) {
    if (parent_stmt == LY_STMT_LEAF_LIST) {
      lVar4 = (ulong)(cur_stmt == LY_STMT_MAX_ELEMENTS) * 4 + 200;
    }
    else {
      if (parent_stmt != LY_STMT_LIST) {
LAB_00186c7a:
        __assert_fail("parent_stmt == LY_STMT_LEAF_LIST || parent_stmt == LY_STMT_REFINE || parent_stmt == LY_STMT_LIST || parent_stmt == LY_STMT_DEVIATE"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                      ,0x5be,
                      "LY_ERR yin_parse_minmax(struct lysp_yin_ctx *, enum ly_stmt, enum ly_stmt, void *)"
                     );
      }
      lVar4 = (ulong)(cur_stmt == LY_STMT_MAX_ELEMENTS) * 4 + 0x88;
    }
    parent = (undefined4 *)((long)dest + lVar4);
    lVar4 = (long)dest + 10;
    exts = (lysp_ext_instance **)((long)dest + 0x38);
  }
  else if (parent_stmt == LY_STMT_DEVIATE) {
    parent = *dest;
    lVar4 = *(long *)((long)dest + 8);
    exts = *(lysp_ext_instance ***)((long)dest + 0x10);
  }
  else {
    if (parent_stmt != LY_STMT_REFINE) goto LAB_00186c7a;
    parent = (undefined4 *)((long)dest + (ulong)(cur_stmt == LY_STMT_MAX_ELEMENTS) * 4 + 0x38);
    lVar4 = (long)dest + 0x48;
    exts = (lysp_ext_instance **)((long)dest + 0x40);
  }
  if (cur_stmt == LY_STMT_MAX_ELEMENTS) {
    local_60 = (char *)0x0;
    local_58.flags = 0;
    local_58._18_6_ = 0;
    local_58.type = LY_STMT_EXTENSION_INSTANCE;
    local_58._4_4_ = 0;
    local_58.dest = (void *)0x0;
    *(byte *)(lVar4 + 1) = *(byte *)(lVar4 + 1) | 4;
    LVar2 = lyxml_ctx_next(ctx->xmlctx);
    if ((LVar2 == LY_SUCCESS) &&
       (LVar2 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&local_60,Y_STR_ARG,LY_STMT_MAX_ELEMENTS),
       pcVar8 = local_60, LVar2 == LY_SUCCESS)) {
      if (((local_60 == (char *)0x0) || ((cVar1 = *local_60, cVar1 == '\0' || (cVar1 == '0')))) ||
         ((cVar1 != 'u' &&
          (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 8) == 0))))
      {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        format = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
      }
      else {
        iVar3 = strcmp(pcVar8,"unbounded");
        if (iVar3 == 0) {
LAB_00186c34:
          LVar2 = yin_parse_content(ctx,&local_58,1,parent,LY_STMT_MAX_ELEMENTS,(char **)0x0,exts);
          goto LAB_001868c5;
        }
        piVar6 = __errno_location();
        *piVar6 = 0;
        uVar7 = strtoull(pcVar8,&local_38,10);
        pcVar8 = local_60;
        if (*local_38 == '\0') {
          if (uVar7 >> 0x20 == 0 && *piVar6 != 0x22) {
            *parent = (int)uVar7;
            goto LAB_00186c34;
          }
          plVar9 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          format = "Value \"%s\" of \"%s\" attribute in \"%s\" element is out of bounds.";
        }
        else {
          plVar9 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          format = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
        }
      }
      ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YIN,format,pcVar8,"value","max-elements");
      LVar2 = LY_EVALID;
    }
LAB_001868c5:
    lydict_remove(ctx->xmlctx->ctx,local_60);
joined_r0x00186c26:
    if (LVar2 == LY_SUCCESS) {
      LVar2 = LY_SUCCESS;
    }
  }
  else {
    local_60 = (char *)0x0;
    local_58.flags = 0;
    local_58._18_6_ = 0;
    local_58.type = LY_STMT_EXTENSION_INSTANCE;
    local_58._4_4_ = 0;
    local_58.dest = (void *)0x0;
    *(byte *)(lVar4 + 1) = *(byte *)(lVar4 + 1) | 2;
    LVar2 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&local_60,Y_STR_ARG,LY_STMT_MIN_ELEMENTS);
    pcVar8 = local_60;
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (((local_60 == (char *)0x0) || (*local_60 == '\0')) ||
       ((*local_60 == '0' && (local_60[1] != '\0')))) {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      pcVar8 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
    }
    else {
      piVar6 = __errno_location();
      *piVar6 = 0;
      uVar7 = strtoull(pcVar8,&local_38,10);
      if (*local_38 == '\0') {
        if (uVar7 >> 0x20 == 0 && *piVar6 != 0x22) {
          *parent = (int)uVar7;
          lydict_remove(ctx->xmlctx->ctx,local_60);
          LVar2 = yin_parse_content(ctx,&local_58,1,parent,LY_STMT_MIN_ELEMENTS,(char **)0x0,exts);
          goto joined_r0x00186c26;
        }
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        pcVar8 = "Value \"%s\" of \"%s\" attribute in \"%s\" element is out of bounds.";
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        pcVar8 = "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element.";
      }
    }
    ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YIN,pcVar8,local_60,"value","min-elements");
    lydict_remove(ctx->xmlctx->ctx,local_60);
    LVar2 = LY_EVALID;
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_minmax(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, enum ly_stmt cur_stmt, void *dest)
{
    uint32_t *lim;
    uint16_t *flags;
    struct lysp_ext_instance **exts;

    assert(cur_stmt == LY_STMT_MAX_ELEMENTS || cur_stmt == LY_STMT_MIN_ELEMENTS);
    assert(parent_stmt == LY_STMT_LEAF_LIST || parent_stmt == LY_STMT_REFINE || parent_stmt == LY_STMT_LIST ||
            parent_stmt == LY_STMT_DEVIATE);

    if (parent_stmt == LY_STMT_LEAF_LIST) {
        lim = (cur_stmt == LY_STMT_MAX_ELEMENTS) ? &((struct lysp_node_leaflist *)dest)->max : &((struct lysp_node_leaflist *)dest)->min;
        flags = &((struct lysp_node_leaflist *)dest)->flags;
        exts = &((struct lysp_node_leaflist *)dest)->exts;
    } else if (parent_stmt == LY_STMT_REFINE) {
        lim = (cur_stmt == LY_STMT_MAX_ELEMENTS) ? &((struct lysp_refine *)dest)->max : &((struct lysp_refine *)dest)->min;
        flags = &((struct lysp_refine *)dest)->flags;
        exts = &((struct lysp_refine *)dest)->exts;
    } else if (parent_stmt == LY_STMT_LIST) {
        lim = (cur_stmt == LY_STMT_MAX_ELEMENTS) ? &((struct lysp_node_list *)dest)->max : &((struct lysp_node_list *)dest)->min;
        flags = &((struct lysp_node_list *)dest)->flags;
        exts = &((struct lysp_node_list *)dest)->exts;
    } else {
        lim = ((struct minmax_dev_meta *)dest)->lim;
        flags = ((struct minmax_dev_meta *)dest)->flags;
        exts = ((struct minmax_dev_meta *)dest)->exts;
    }

    if (cur_stmt == LY_STMT_MAX_ELEMENTS) {
        LY_CHECK_RET(yin_parse_maxelements(ctx, lim, flags, exts));
    } else {
        LY_CHECK_RET(yin_parse_minelements(ctx, lim, flags, exts));
    }

    return LY_SUCCESS;
}